

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O0

void composition_solid_source_atop(uint32_t *dest,int length,uint32_t color,uint32_t const_alpha)

{
  uint32_t uVar1;
  int local_24;
  uint32_t d;
  int i;
  uint32_t sia;
  uint32_t const_alpha_local;
  uint32_t color_local;
  int length_local;
  uint32_t *dest_local;
  
  sia = color;
  if (const_alpha != 0xff) {
    sia = BYTE_MUL(color,const_alpha);
  }
  for (local_24 = 0; local_24 < length; local_24 = local_24 + 1) {
    uVar1 = INTERPOLATE_PIXEL(sia,dest[local_24] >> 0x18,dest[local_24],(sia ^ 0xffffffff) >> 0x18);
    dest[local_24] = uVar1;
  }
  return;
}

Assistant:

static void composition_solid_source_atop(uint32_t* dest, int length, uint32_t color, uint32_t const_alpha)
{
    if(const_alpha != 255)
        color = BYTE_MUL(color, const_alpha);
    uint32_t sia = plutovg_alpha(~color);
    for(int i = 0; i < length; i++) {
        uint32_t d = dest[i];
        dest[i] = INTERPOLATE_PIXEL(color, plutovg_alpha(d), d, sia);
    }
}